

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O1

qpTestResult __thiscall
gl4cts::ClipControlDepthModeZeroToOneTest::ValidateFramebuffer
          (ClipControlDepthModeZeroToOneTest *this,Context *context)

{
  RenderContext *pRVar1;
  TestLog *log;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  qpTestResult qVar5;
  int iVar6;
  Surface renderedColorFrame;
  TextureFormat depthFormat;
  Surface referenceColorFrame;
  TextureLevel importanceMaskFrame;
  TextureLevel referenceDepthFrame;
  TextureLevel renderedDepthFrame;
  Surface local_140;
  float local_128;
  float local_124;
  double local_120;
  TextureFormat local_118;
  Surface local_110;
  ClipControlDepthModeZeroToOneTest *local_f8;
  TestLog *local_f0;
  double local_e8;
  double local_e0;
  TextureFormat local_d8;
  PixelBufferAccess local_d0;
  TextureLevel local_a8;
  TextureLevel local_80;
  TextureLevel local_58;
  
  local_f8 = this;
  iVar3 = (*context->m_renderCtx->_vptr_RenderContext[4])();
  iVar6 = *(int *)CONCAT44(extraout_var,iVar3);
  iVar3 = ((int *)CONCAT44(extraout_var,iVar3))[1];
  tcu::Surface::Surface(&local_140,iVar6,iVar3);
  tcu::Surface::Surface(&local_110,iVar6,iVar3);
  local_118.order = D;
  local_118.type = FLOAT;
  tcu::TextureLevel::TextureLevel(&local_58,&local_118,iVar6,iVar3,1);
  tcu::TextureLevel::TextureLevel(&local_80,&local_118,iVar6,iVar3,1);
  tcu::TextureLevel::TextureLevel(&local_a8,&local_118,iVar6,iVar3,1);
  local_f0 = context->m_testCtx->m_log;
  if (0 < local_140.m_height) {
    local_e8 = (double)(2.0 / (float)local_140.m_width + 2.0 / (float)local_140.m_height);
    iVar6 = 0;
    do {
      if (0 < local_140.m_width) {
        local_128 = ((float)iVar6 + 0.5) / (float)local_140.m_height;
        local_120 = (double)local_128;
        iVar3 = 0;
        do {
          local_124 = ((float)iVar3 + 0.5) / (float)local_140.m_width;
          local_e0 = 1.0 - (double)local_124;
          if ((local_120 < local_e0 - local_e8) || (local_e0 + local_e8 < local_120)) {
            tcu::TextureLevel::getAccess(&local_d0,&local_a8);
            tcu::PixelBufferAccess::setPixDepth(&local_d0,1.0,iVar3,iVar6,0);
          }
          else {
            tcu::TextureLevel::getAccess(&local_d0,&local_a8);
            tcu::PixelBufferAccess::setPixDepth(&local_d0,0.0,iVar3,iVar6,0);
          }
          lVar4 = (long)(local_110.m_width * iVar6 + iVar3);
          if (local_e0 <= local_120) {
            *(undefined4 *)((long)local_110.m_pixels.m_ptr + lVar4 * 4) = 0xff00ff00;
            tcu::TextureLevel::getAccess(&local_d0,&local_80);
            tcu::PixelBufferAccess::setPixDepth
                      (&local_d0,local_124 + -1.0 + local_128,iVar3,iVar6,0);
          }
          else {
            *(undefined4 *)((long)local_110.m_pixels.m_ptr + lVar4 * 4) = 0xff0000ff;
            tcu::TextureLevel::getAccess(&local_d0,&local_80);
            tcu::PixelBufferAccess::setPixDepth(&local_d0,0.5,iVar3,iVar6,0);
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 < local_140.m_width);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_140.m_height);
  }
  pRVar1 = context->m_renderCtx;
  local_d8.order = RGBA;
  local_d8.type = UNORM_INT8;
  if ((void *)local_140.m_pixels.m_cap != (void *)0x0) {
    local_140.m_pixels.m_cap = (size_t)local_140.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_d0,&local_d8,local_140.m_width,local_140.m_height,1,
             (void *)local_140.m_pixels.m_cap);
  log = local_f0;
  glu::readPixels(pRVar1,0,0,&local_d0);
  qVar5 = QP_TEST_RESULT_FAIL;
  bVar2 = tcu::fuzzyCompare(log,"Result","Color image comparison result",&local_110,&local_140,0.05,
                            COMPARE_LOG_RESULT);
  if (bVar2) {
    pRVar1 = context->m_renderCtx;
    tcu::TextureLevel::getAccess(&local_d0,&local_58);
    glu::readPixels(pRVar1,0,0,&local_d0);
    bVar2 = ClipControlRenderBaseTest::fuzzyDepthCompare
                      (&local_f8->super_ClipControlRenderBaseTest,log,"Result",
                       "Depth image comparison result",&local_80,&local_58,0.05,&local_a8);
    qVar5 = (qpTestResult)!bVar2;
  }
  tcu::TextureLevel::~TextureLevel(&local_a8);
  tcu::TextureLevel::~TextureLevel(&local_80);
  tcu::TextureLevel::~TextureLevel(&local_58);
  tcu::Surface::~Surface(&local_110);
  tcu::Surface::~Surface(&local_140);
  return qVar5;
}

Assistant:

qpTestResult ValidateFramebuffer(deqp::Context& context)
	{
		const tcu::RenderTarget& renderTarget = context.getRenderContext().getRenderTarget();
		glw::GLuint				 viewportW	= renderTarget.getWidth();
		glw::GLuint				 viewportH	= renderTarget.getHeight();
		tcu::Surface			 renderedColorFrame(viewportW, viewportH);
		tcu::Surface			 referenceColorFrame(viewportW, viewportH);
		tcu::TextureFormat		 depthFormat(tcu::TextureFormat::D, tcu::TextureFormat::FLOAT);
		tcu::TextureLevel		 renderedDepthFrame(depthFormat, viewportW, viewportH);
		tcu::TextureLevel		 referenceDepthFrame(depthFormat, viewportW, viewportH);
		tcu::TextureLevel		 importanceMaskFrame(depthFormat, viewportW, viewportH);

		tcu::TestLog& log = context.getTestContext().getLog();

		const float rasterizationError =
			2.0f / (float)renderedColorFrame.getHeight() + 2.0f / (float)renderedColorFrame.getWidth();

		for (int y = 0; y < renderedColorFrame.getHeight(); y++)
		{
			float yCoord = ((float)(y) + 0.5f) / (float)renderedColorFrame.getHeight();

			for (int x = 0; x < renderedColorFrame.getWidth(); x++)
			{
				float xCoord = ((float)(x) + 0.5f) / (float)renderedColorFrame.getWidth();

				if (yCoord >= 1.0 - xCoord - rasterizationError && yCoord <= 1.0 - xCoord + rasterizationError)
				{
					importanceMaskFrame.getAccess().setPixDepth(0.0f, x, y);
				}
				else
				{
					importanceMaskFrame.getAccess().setPixDepth(1.0f, x, y);
				}

				if (yCoord < 1.0 - xCoord)
				{
					referenceColorFrame.setPixel(x, y, tcu::RGBA::red());
					referenceDepthFrame.getAccess().setPixDepth(0.5f, x, y);
				}
				else
				{
					referenceColorFrame.setPixel(x, y, tcu::RGBA::green());

					referenceDepthFrame.getAccess().setPixDepth(-1.0f + xCoord + yCoord, x, y);
				}
			}
		}

		glu::readPixels(context.getRenderContext(), 0, 0, renderedColorFrame.getAccess());
		if (!tcu::fuzzyCompare(log, "Result", "Color image comparison result", referenceColorFrame, renderedColorFrame,
							   0.05f, tcu::COMPARE_LOG_RESULT))
		{

			return QP_TEST_RESULT_FAIL;
		}

		glu::readPixels(context.getRenderContext(), 0, 0, renderedDepthFrame.getAccess());
		if (!fuzzyDepthCompare(log, "Result", "Depth image comparison result", referenceDepthFrame, renderedDepthFrame,
							   0.05f, &importanceMaskFrame))
		{
			return QP_TEST_RESULT_FAIL;
		}
		return QP_TEST_RESULT_PASS;
	}